

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_msg.c
# Opt level: O1

TestResult * receive_test_result(int waserror)

{
  RcvMsg *rmsg;
  TestResult *pTVar1;
  long lVar2;
  ck_result_ctx cVar3;
  long lVar4;
  int line;
  FILE *__stream;
  char *pcVar5;
  
  __stream = (FILE *)send_file2;
  if ((send_file2 == (FILE *)0x0) && (__stream = (FILE *)send_file1, send_file1 == (FILE *)0x0)) {
    pcVar5 = 
    "Unable to report test progress or a failure; was an ck_assert or ck_abort function called while not running tests?"
    ;
    line = 0x50;
  }
  else {
    rewind(__stream);
    rmsg = punpack((FILE *)__stream);
    if (rmsg != (RcvMsg *)0x0) {
      teardown_pipe();
      setup_pipe();
      pTVar1 = tr_create();
      pcVar5 = rmsg->msg;
      if ((waserror == 0) && (pcVar5 == (char *)0x0)) {
        if (rmsg->lastctx == CK_CTX_SETUP) {
          pTVar1->ctx = CK_CTX_SETUP;
          pTVar1->msg = (char *)0x0;
          lVar2 = 0x10;
          lVar4 = 8;
        }
        else {
          pTVar1->ctx = CK_CTX_TEST;
          pTVar1->msg = (char *)0x0;
          pTVar1->duration = rmsg->duration;
          lVar2 = 0x20;
          lVar4 = 0x18;
        }
      }
      else {
        cVar3 = rmsg->failctx;
        if (cVar3 == CK_CTX_INVALID) {
          cVar3 = rmsg->lastctx;
        }
        pTVar1->ctx = cVar3;
        pTVar1->msg = pcVar5;
        rmsg->msg = (char *)0x0;
        lVar2 = (ulong)(cVar3 == CK_CTX_TEST) * 0x10;
        lVar4 = lVar2 + 8;
        lVar2 = lVar2 + 0x10;
      }
      pTVar1->file = *(char **)((long)&rmsg->lastctx + lVar4);
      pTVar1->line = *(int *)((long)&rmsg->lastctx + lVar2);
      *(undefined8 *)((long)&rmsg->lastctx + lVar4) = 0;
      *(undefined4 *)((long)&rmsg->lastctx + lVar2) = 0xffffffff;
      rcvmsg_free(rmsg);
      return pTVar1;
    }
    pcVar5 = "Error in call to punpack";
    line = 0x85;
  }
  eprintf(pcVar5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_msg.c"
          ,line);
}

Assistant:

TestResult *receive_test_result(int waserror)
{
    FILE *fp;
    RcvMsg *rmsg;
    TestResult *result;

    fp = get_pipe();
    if(fp == NULL)
    {
        eprintf("Error in call to get_pipe", __FILE__, __LINE__ - 2);
    }

    rewind(fp);
    rmsg = punpack(fp);

    if(rmsg == NULL)
    {
        eprintf("Error in call to punpack", __FILE__, __LINE__ - 4);
    }

    teardown_pipe();
    setup_pipe();

    result = construct_test_result(rmsg, waserror);
    rcvmsg_free(rmsg);
    return result;
}